

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

shared_ptr<cxxopts::Value> cxxopts::value<bool>(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<cxxopts::Value> sVar1;
  standard_value<bool> *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  undefined1 local_21;
  
  local_38 = (standard_value<bool> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cxxopts::values::standard_value<bool>,std::allocator<cxxopts::values::standard_value<bool>>>
            (&local_30,&local_38,(allocator<cxxopts::values::standard_value<bool>_> *)&local_21);
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<cxxopts::values::standard_value<bool>,cxxopts::values::standard_value<bool>>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_38,local_38);
  in_RDI->_vptr_Value = (_func_int **)local_38;
  (in_RDI->super_enable_shared_from_this<cxxopts::Value>)._M_weak_this.
  super___weak_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (in_RDI->super_enable_shared_from_this<cxxopts::Value>)._M_weak_this.
  super___weak_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_30._M_pi;
  sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<cxxopts::Value>)
         sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Value>
  value()
  {
    return std::make_shared<values::standard_value<T>>();
  }